

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O1

void * rw::destroyHAnim(void *object,int32 offset,int32 param_3)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = (long)offset;
  lVar2 = *(long *)((long)object + lVar5 + 8);
  if (lVar2 != 0) {
    iVar1 = *(int *)(lVar2 + 4);
    if (0 < (long)iVar1) {
      lVar3 = *(long *)(lVar2 + 0x18);
      lVar4 = 0;
      do {
        *(undefined8 *)(lVar3 + 0x10 + lVar4) = 0;
        lVar4 = lVar4 + 0x18;
      } while ((long)iVar1 * 0x18 != lVar4);
    }
    if (*(void **)(lVar2 + 0x20) == object) {
      AnimInterpolator::destroy(*(AnimInterpolator **)(lVar2 + 0x30));
      (*DAT_00148850)(*(undefined8 *)(lVar2 + 0x10));
      (*DAT_00148850)(*(undefined8 *)(lVar2 + 0x18));
      (*DAT_00148850)(lVar2);
    }
  }
  *(undefined4 *)((long)object + lVar5) = 0xffffffff;
  *(undefined8 *)((long)object + lVar5 + 8) = 0;
  return object;
}

Assistant:

static void*
destroyHAnim(void *object, int32 offset, int32)
{
	int i;
	HAnimData *hanim = PLUGINOFFSET(HAnimData, object, offset);
	if(hanim->hierarchy){
		for(i = 0; i < hanim->hierarchy->numNodes; i++)
			hanim->hierarchy->nodeInfo[i].frame = nil;
		if(object == hanim->hierarchy->parentFrame)
			hanim->hierarchy->destroy();
	}
	hanim->id = -1;
	hanim->hierarchy = nil;
	return object;
}